

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

void __thiscall
gulcalc::output_mean
          (gulcalc *this,OASIS_FLOAT tiv,prob_mean *pp,int bin_count,OASIS_FLOAT *gul_mean,
          OASIS_FLOAT *std_dev,OASIS_FLOAT *max_loss)

{
  float fVar1;
  long lVar2;
  int iVar3;
  OASIS_FLOAT OVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  *gul_mean = 0.0;
  *std_dev = 0.0;
  OVar4 = *gul_mean;
  lVar2 = 0;
  iVar3 = 0;
  if (0 < bin_count) {
    iVar3 = bin_count;
  }
  fVar5 = 0.0;
  fVar6 = 0.0;
  for (; iVar3 != (int)lVar2; lVar2 = lVar2 + 1) {
    fVar7 = 0.0;
    if ((int)lVar2 != 0) {
      fVar7 = fVar6;
    }
    fVar6 = pp[lVar2].prob_to;
    fVar1 = pp[lVar2].bin_mean;
    fVar7 = (fVar6 - fVar7) * fVar1;
    OVar4 = OVar4 + fVar7 * tiv;
    *gul_mean = OVar4;
    fVar5 = fVar5 + fVar1 * fVar7 * tiv * tiv;
  }
  fVar5 = fVar5 - OVar4 * OVar4;
  fVar6 = 0.0;
  if (0.0 <= fVar5) {
    fVar6 = fVar5;
  }
  *std_dev = SQRT(fVar6);
  *max_loss = tiv * (this->damagebindictionary_vec_->
                    super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>).
                    _M_impl.super__Vector_impl_data._M_start[(long)bin_count + -1].bin_to;
  return;
}

Assistant:

void gulcalc::output_mean(OASIS_FLOAT tiv, prob_mean *pp, int bin_count,
			  OASIS_FLOAT &gul_mean,  OASIS_FLOAT &std_dev,
			  OASIS_FLOAT &max_loss)
{
	OASIS_FLOAT last_prob_to = 0;
	gul_mean = 0;
	std_dev = 0;
	OASIS_FLOAT ctr_var = 0;

	for (int bin_index = 0; bin_index < bin_count; bin_index++)
	{
		probrec p;
		if (bin_index == 0) {
			p.prob_from = 0;
		} else {
			p.prob_from = last_prob_to;
		}
		p.prob_to = pp->prob_to;
		p.bin_mean = pp->bin_mean;
		last_prob_to = pp->prob_to;
		gul_mean = gul_mean + ((p.prob_to - p.prob_from) *p.bin_mean * tiv);
		ctr_var = ctr_var + ((p.prob_to - p.prob_from) *p.bin_mean*p.bin_mean * tiv * tiv);
		pp++;
	}
	OASIS_FLOAT g2 = gul_mean * gul_mean;
	std_dev = ctr_var - g2;
	if (std_dev < 0) std_dev  = 0;
	std_dev = sqrt(std_dev);

	max_loss = tiv * (*damagebindictionary_vec_)[bin_count - 1].bin_to;
}